

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O2

int zmq_send_const(void *s_,void *buf_,size_t len_,int flags_)

{
  int iVar1;
  int iVar2;
  socket_base_t *s__00;
  int *piVar3;
  char *errmsg_;
  zmq_msg_t msg;
  
  iVar2 = (int)&msg;
  s__00 = as_socket_base_t(s_);
  if ((s__00 != (socket_base_t *)0x0) &&
     (iVar1 = zmq::msg_t::init_data((msg_t *)&msg,buf_,len_,(undefined1 *)0x0,(void *)0x0),
     iVar1 == 0)) {
    iVar1 = s_sendmsg(s__00,&msg,flags_);
    if (-1 < iVar1) {
      return iVar1;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    iVar2 = zmq::msg_t::close((msg_t *)&msg,iVar2);
    if (iVar2 != 0) {
      errmsg_ = strerror(*piVar3);
      fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zmq.cpp"
              ,0x1b5);
      fflush(_stderr);
      zmq::zmq_abort(errmsg_);
    }
    *piVar3 = iVar1;
  }
  return -1;
}

Assistant:

int zmq_send_const (void *s_, const void *buf_, size_t len_, int flags_)
{
    zmq::socket_base_t *s = as_socket_base_t (s_);
    if (!s)
        return -1;
    zmq_msg_t msg;
    int rc =
      zmq_msg_init_data (&msg, const_cast<void *> (buf_), len_, NULL, NULL);
    if (rc != 0)
        return -1;

    rc = s_sendmsg (s, &msg, flags_);
    if (unlikely (rc < 0)) {
        const int err = errno;
        const int rc2 = zmq_msg_close (&msg);
        errno_assert (rc2 == 0);
        errno = err;
        return -1;
    }
    //  Note the optimisation here. We don't close the msg object as it is
    //  empty anyway. This may change when implementation of zmq_msg_t changes.
    return rc;
}